

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SiameseDecoder.cpp
# Opt level: O3

uint __thiscall
siamese::DecoderPacketWindow::FindNextGotElement(DecoderPacketWindow *this,uint elementStart)

{
  DecoderSubwindow *pDVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  
  uVar3 = this->Count;
  if (elementStart < uVar3) {
    uVar5 = (ulong)(elementStart >> 6);
    uVar4 = uVar3 + 0x3f >> 6;
    if (elementStart >> 6 < uVar4) {
      uVar3 = elementStart & 0x3f;
      iVar2 = -(elementStart & 0xffffffc0);
      do {
        pDVar1 = (this->Subwindows).DataPtr[uVar5];
        if ((pDVar1->GotCount != 0) &&
           (uVar3 = pktalloc::CustomBitSet<64U>::FindFirstSet(&pDVar1->Got,uVar3,0x40), uVar3 < 0x40
           )) {
          if (uVar3 - iVar2 < this->Count) {
            return uVar3 - iVar2;
          }
          return this->Count;
        }
        uVar5 = uVar5 + 1;
        iVar2 = iVar2 + -0x40;
        uVar3 = 0;
      } while (uVar4 != uVar5);
      uVar3 = this->Count;
    }
  }
  return uVar3;
}

Assistant:

unsigned DecoderPacketWindow::FindNextGotElement(unsigned elementStart)
{
    if (elementStart >= Count) {
        return Count;
    }

    const unsigned subwindowEnd = (Count + kSubwindowSize - 1) / kSubwindowSize;
    unsigned subwindowIndex = elementStart / kSubwindowSize;
    unsigned bitIndex = elementStart % kSubwindowSize;
    SIAMESE_DEBUG_ASSERT(subwindowEnd <= Subwindows.GetSize());
    SIAMESE_DEBUG_ASSERT(subwindowIndex < Subwindows.GetSize());

    while (subwindowIndex < subwindowEnd)
    {
        // If there may be any got packets in this subwindow:
        if (Subwindows.GetRef(subwindowIndex)->GotCount > 0)
        {
            for (;;)
            {
                // Seek next set bit
                bitIndex = Subwindows.GetRef(subwindowIndex)->Got.FindFirstSet(bitIndex);

                // If there were none, skip this subwindow
                if (bitIndex >= kSubwindowSize) {
                    break;
                }

                // Calculate element index and stop if we hit the end of the valid data
                unsigned nextElement = subwindowIndex * kSubwindowSize + bitIndex;
                if (nextElement > Count) {
                    nextElement = Count;
                }

                return nextElement;
            }
        }

        // Reset bit index to the front of the next subwindow
        bitIndex = 0;

        // Check next subwindow
        ++subwindowIndex;
    }

    return Count;
}